

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZEqnArray<long_double>_>::TPZVec
          (TPZVec<TPZEqnArray<long_double>_> *this,TPZVec<TPZEqnArray<long_double>_> *rval)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  TPZEqnArray<long_double> *pTVar4;
  undefined1 auVar5 [16];
  void *pvVar6;
  TPZEqnArray<long_double> *pTVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_019b6180;
  uVar3 = rval->fNElements;
  this->fNElements = uVar3;
  lVar8 = rval->fNAlloc;
  if (lVar8 == 0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar3;
    uVar10 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x51e0),8) == 0) {
      uVar10 = SUB168(auVar5 * ZEXT816(0x51e0),0) | 0x10;
    }
    pvVar6 = operator_new__(uVar10);
    *(ulong *)((long)pvVar6 + 8) = uVar3;
    if (uVar3 != 0) {
      lVar8 = 0;
      pTVar7 = (TPZEqnArray<long_double> *)((long)pvVar6 + 0x10);
      do {
        TPZEqnArray<long_double>::TPZEqnArray(pTVar7);
        lVar8 = lVar8 + -0x51e0;
        pTVar7 = pTVar7 + 1;
      } while (uVar3 * -0x51e0 - lVar8 != 0);
    }
    this->fStore = (TPZEqnArray<long_double> *)((long)pvVar6 + 0x10);
    if (0 < this->fNElements) {
      lVar8 = 0;
      lVar9 = 0;
      do {
        pTVar7 = rval->fStore;
        pTVar4 = this->fStore;
        puVar1 = (undefined8 *)
                 ((long)(pTVar7->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar8 + -0x28);
        puVar2 = (undefined8 *)
                 ((long)(pTVar4->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar8 + -0x28);
        *puVar2 = *puVar1;
        TPZManVector<int,_100>::operator=
                  ((TPZManVector<int,_100> *)(puVar2 + 1),(TPZManVector<int,_100> *)(puVar1 + 1));
        TPZManVector<int,_100>::operator=
                  ((TPZManVector<int,_100> *)
                   ((long)(pTVar4->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar8 + -0x20
                   ),(TPZManVector<int,_100> *)
                     ((long)(pTVar7->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar8 + -0x20));
        TPZManVector<long_double,_1000>::operator=
                  ((TPZManVector<long_double,_1000> *)
                   ((long)(pTVar4->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                   lVar8 + -0x20),
                   (TPZManVector<long_double,_1000> *)
                   ((long)(pTVar7->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                   lVar8 + -0x20));
        TPZManVector<int,_1000>::operator=
                  ((TPZManVector<int,_1000> *)
                   ((long)(pTVar4->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar8 + -0x20),
                   (TPZManVector<int,_1000> *)
                   ((long)(pTVar7->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar8 + -0x20))
        ;
        *(undefined4 *)(puVar2 + 0xa3a) = *(undefined4 *)(puVar1 + 0xa3a);
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x51e0;
      } while (lVar9 < this->fNElements);
    }
  }
  else {
    this->fStore = rval->fStore;
    this->fNAlloc = lVar8;
    rval->fStore = (TPZEqnArray<long_double> *)0x0;
    rval->fNAlloc = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}